

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close.c
# Opt level: O0

void connect_cb(uv_connect_t *req,int status)

{
  uv_stream_t *stream_00;
  int iVar1;
  uv_buf_t uVar2;
  char *pcStack_10048;
  char *pcStack_10040;
  uv_write_t *write_req;
  int iStack_10028;
  int r;
  int j;
  int i;
  uv_stream_t *stream;
  uv_buf_t send_bufs [4096];
  int status_local;
  uv_connect_t *req_local;
  
  stream_00 = connect_req.handle;
  if (req != &connect_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
            ,0x76,"req == &connect_req");
    abort();
  }
  if (status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
            ,0x77,"status == 0");
    abort();
  }
  connect_cb_called = connect_cb_called + 1;
  for (r = 0; r < 3; r = r + 1) {
    for (iStack_10028 = 0; iStack_10028 < 0x1000; iStack_10028 = iStack_10028 + 1) {
      uVar2 = uv_buf_init(send_buffer + bytes_sent,0x2728);
      pcStack_10048 = uVar2.base;
      send_bufs[(long)iStack_10028 + -1].len = (size_t)pcStack_10048;
      pcStack_10040 = (char *)uVar2.len;
      send_bufs[iStack_10028].base = pcStack_10040;
      bytes_sent = bytes_sent + 0x2728;
    }
    iVar1 = uv_write(write_reqs + r,stream_00,(uv_buf_t *)&stream,0x1000,write_cb);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
              ,0x86,"r == 0");
      abort();
    }
  }
  iVar1 = uv_shutdown(&shutdown_req,stream_00,shutdown_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
            ,0x8b,"r == 0");
    abort();
  }
  iVar1 = uv_read_start(stream_00,alloc_cb,read_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
            ,0x8f,"r == 0");
    abort();
  }
  return;
}

Assistant:

static void connect_cb(uv_connect_t* conn_req, int status) {
  uv_write_t* req;
  uv_buf_t buf;
  int i, r;

  buf = uv_buf_init("PING", 4);
  for (i = 0; i < NUM_WRITE_REQS; i++) {
    req = malloc(sizeof *req);
    ASSERT(req != NULL);

    r = uv_write(req, (uv_stream_t*)&tcp_handle, &buf, 1, write_cb);
    ASSERT(r == 0);
  }

  uv_close((uv_handle_t*)&tcp_handle, close_cb);
}